

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleListDecoder.h
# Opt level: O2

O3DGCErrorCode __thiscall
o3dgc::TriangleListDecoder<unsigned_short>::Decode
          (TriangleListDecoder<unsigned_short> *this,unsigned_short *triangles,long numTriangles,
          long numVertices,BinaryStream *bstream,unsigned_long *iterator)

{
  byte bVar1;
  bool bVar2;
  O3DGCErrorCode OVar3;
  unsigned_long uVar4;
  
  uVar4 = *iterator;
  *iterator = uVar4 + 1;
  bVar1 = (bstream->m_stream).m_buffer[uVar4];
  this->m_decodeTrianglesOrder = (bool)(bVar1 >> 1 & 1);
  bVar2 = (bool)(bVar1 & 1);
  this->m_decodeVerticesOrder = bVar2;
  if (bVar2 == false) {
    uVar4 = BinaryStream::ReadUInt32(bstream,iterator,this->m_streamType);
    Init(this,triangles,numTriangles,numVertices,uVar4);
    CompressedTriangleFans::Load
              (&this->m_ctfans,bstream,iterator,this->m_decodeTrianglesOrder,this->m_streamType);
    Decompress(this);
    OVar3 = O3DGC_OK;
  }
  else {
    OVar3 = O3DGC_ERROR_NON_SUPPORTED_FEATURE;
  }
  return OVar3;
}

Assistant:

O3DGCErrorCode              Decode(T * const triangles,
                                           const long numTriangles,
                                           const long numVertices,
                                           const BinaryStream & bstream,
                                           unsigned long & iterator)
                                    {
                                        unsigned char compressionMask = bstream.ReadUChar(iterator, m_streamType); 
                                        m_decodeTrianglesOrder = ( (compressionMask&2) != 0);
                                        m_decodeVerticesOrder = ( (compressionMask&1) != 0); 
                                        if (m_decodeVerticesOrder)  // vertices reordering not supported
                                        {
                                            return O3DGC_ERROR_NON_SUPPORTED_FEATURE;
                                        }
                                        unsigned long maxSizeV2T = bstream.ReadUInt32(iterator, m_streamType);
                                        Init(triangles, numTriangles, numVertices, maxSizeV2T);
                                        m_ctfans.Load(bstream, iterator, m_decodeTrianglesOrder, m_streamType);
                                        Decompress();
                                        return O3DGC_OK;
                                    }